

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptorKeyAndModuleName
          (Generator *this,ServiceDescriptor *descriptor)

{
  string module_name;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_50,this,descriptor);
  if (this->pure_python_workable_ == false) {
    std::operator+(&local_30,"_descriptor.ServiceDescriptor(full_name=\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(descriptor + 8) + 0x20));
    std::operator+(&local_70,&local_30,"\')");
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
  }
  io::Printer::Print<char[15],char[11],char[16],std::__cxx11::string>
            (this->printer_,"$descriptor_key$ = $descriptor_name$,\n",
             (char (*) [15])"descriptor_key",(char (*) [11])"DESCRIPTOR",(char (*) [16])0x3df796,
             &local_50);
  anon_unknown_0::ModuleName(&local_70,*(string **)this->file_);
  io::Printer::Print<char[12],std::__cxx11::string>
            (this->printer_,"__module__ = \'$module_name$\'\n",(char (*) [12])"module_name",
             &local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Generator::PrintDescriptorKeyAndModuleName(
    const ServiceDescriptor& descriptor) const {
  std::string name = ModuleLevelServiceDescriptorName(descriptor);
  if (!pure_python_workable_) {
    name = "_descriptor.ServiceDescriptor(full_name='" +
           descriptor.full_name() + "')";
  }
  printer_->Print("$descriptor_key$ = $descriptor_name$,\n", "descriptor_key",
                  kDescriptorKey, "descriptor_name", name);
  std::string module_name = ModuleName(file_->name());
  printer_->Print("__module__ = '$module_name$'\n", "module_name", module_name);
}